

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ValueNode * __thiscall DL::Parser::gr_value(Parser *this)

{
  Lexer *this_00;
  SourceLogger *pSVar1;
  bool bVar2;
  line_t lVar3;
  column_t cVar4;
  ValueNode *pVVar5;
  StatementNode *pSVar6;
  ExpressionNode *pEVar7;
  char *pcVar8;
  ostream *poVar9;
  Token str;
  Token str_2;
  undefined1 local_318 [8];
  _Alloc_hider local_310;
  size_type local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  Token local_2f0;
  Token local_2c8;
  Token local_2a0;
  Token local_278;
  Token local_250;
  Token local_228;
  Token local_200;
  Token local_1d8;
  undefined1 local_1b0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [8];
  ios_base local_130 [264];
  
  pVVar5 = (ValueNode *)operator_new(0x30);
  (pVVar5->_String)._M_dataplus._M_p = (pointer)&(pVVar5->_String).field_2;
  (pVVar5->_String)._M_string_length = 0;
  (pVVar5->_String).field_2._M_local_buf[0] = '\0';
  bVar2 = lookahead(this,T_OpenParanthese);
  if (bVar2) {
    match(&local_1d8,this,T_OpenParanthese);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8.Value._M_dataplus._M_p != &local_1d8.Value.field_2) {
      operator_delete(local_1d8.Value._M_dataplus._M_p,
                      local_1d8.Value.field_2._M_allocated_capacity + 1);
    }
    pVVar5->Type = VNT_Statement;
    pSVar6 = gr_statement(this);
    (pVVar5->field_1)._Statement = pSVar6;
    match(&local_200,this,T_CloseParanthese);
    local_198[0]._M_allocated_capacity = local_200.Value.field_2._M_allocated_capacity;
    local_1b0._8_8_ = local_200.Value._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.Value._M_dataplus._M_p == &local_200.Value.field_2) {
      return pVVar5;
    }
  }
  else {
    bVar2 = lookahead(this,T_OpenSquareBracket);
    if (bVar2) {
      match(&local_228,this,T_OpenSquareBracket);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228.Value._M_dataplus._M_p != &local_228.Value.field_2) {
        operator_delete(local_228.Value._M_dataplus._M_p,
                        local_228.Value.field_2._M_allocated_capacity + 1);
      }
      pVVar5->Type = VNT_Statement;
      pSVar6 = gr_array(this);
      (pVVar5->field_1)._Statement = pSVar6;
      match(&local_250,this,T_CloseSquareBracket);
      local_198[0]._M_allocated_capacity = local_250.Value.field_2._M_allocated_capacity;
      local_1b0._8_8_ = local_250.Value._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250.Value._M_dataplus._M_p == &local_250.Value.field_2) {
        return pVVar5;
      }
    }
    else {
      bVar2 = lookahead(this,T_ExpressionParanthese);
      if (bVar2) {
        match(&local_278,this,T_ExpressionParanthese);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278.Value._M_dataplus._M_p != &local_278.Value.field_2) {
          operator_delete(local_278.Value._M_dataplus._M_p,
                          local_278.Value.field_2._M_allocated_capacity + 1);
        }
        pVVar5->Type = VNT_Expression;
        pEVar7 = gr_expression(this);
        (pVVar5->field_1)._Expression = pEVar7;
        match(&local_2a0,this,T_CloseParanthese);
        local_198[0]._M_allocated_capacity = local_2a0.Value.field_2._M_allocated_capacity;
        local_1b0._8_8_ = local_2a0.Value._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0.Value._M_dataplus._M_p == &local_2a0.Value.field_2) {
          return pVVar5;
        }
      }
      else {
        bVar2 = lookahead(this,T_Integer);
        if (bVar2) {
          match((Token *)local_318,this,T_Integer);
          pVVar5->Type = VNT_Integer;
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)local_1b0,(string *)&local_310,_S_in);
          std::istream::_M_extract<long>((long *)local_1b0);
        }
        else {
          bVar2 = lookahead(this,T_Float);
          if (!bVar2) {
            bVar2 = lookahead(this,T_String);
            if (!bVar2) {
              bVar2 = lookahead(this,T_True);
              if (bVar2) {
                match(&local_2c8,this,T_True);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8.Value._M_dataplus._M_p != &local_2c8.Value.field_2) {
                  operator_delete(local_2c8.Value._M_dataplus._M_p,
                                  local_2c8.Value.field_2._M_allocated_capacity + 1);
                }
                pVVar5->Type = VNT_Boolean;
                (pVVar5->field_1)._Boolean = true;
                return pVVar5;
              }
              bVar2 = lookahead(this,T_False);
              if (bVar2) {
                match(&local_2f0,this,T_False);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2f0.Value._M_dataplus._M_p != &local_2f0.Value.field_2) {
                  operator_delete(local_2f0.Value._M_dataplus._M_p,
                                  local_2f0.Value.field_2._M_allocated_capacity + 1);
                }
                pVVar5->Type = VNT_Boolean;
                (pVVar5->field_1)._Boolean = false;
                return pVVar5;
              }
              pVVar5->Type = VNT_Unknown;
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b0 + 0x10),"INTERNAL: Unknown lookahead \'",0x1d);
              this_00 = &this->mLexer;
              Lexer::look((Token *)local_318,this_00);
              pcVar8 = tokenToString(local_318._0_4_);
              poVar9 = std::operator<<((ostream *)(local_1b0 + 0x10),pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\' for values.",0xd);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_310._M_p != &local_300) {
                operator_delete(local_310._M_p,local_300._M_allocated_capacity + 1);
              }
              pSVar1 = this->mLogger;
              lVar3 = Lexer::currentLine(this_00);
              cVar4 = Lexer::currentColumn(this_00);
              std::__cxx11::stringbuf::str();
              (*pSVar1->_vptr_SourceLogger[2])(pSVar1,(ulong)lVar3,(ulong)cVar4,4,local_318);
              if ((size_type *)CONCAT44(local_318._4_4_,local_318._0_4_) != &local_308) {
                operator_delete((size_type *)CONCAT44(local_318._4_4_,local_318._0_4_),local_308 + 1
                               );
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
              std::ios_base::~ios_base(local_130);
              return pVVar5;
            }
            match((Token *)local_1b0,this,T_String);
            pVVar5->Type = VNT_String;
            std::__cxx11::string::_M_assign((string *)&pVVar5->_String);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._8_8_ == local_198) {
              return pVVar5;
            }
            goto LAB_0010fd8c;
          }
          match((Token *)local_318,this,T_Float);
          pVVar5->Type = VNT_Float;
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)local_1b0,(string *)&local_310,_S_in);
          std::istream::_M_extract<float>((float *)local_1b0);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
        std::ios_base::~ios_base(local_138);
        local_198[0]._M_allocated_capacity = local_300._M_allocated_capacity;
        local_1b0._8_8_ = local_310._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_p == &local_300) {
          return pVVar5;
        }
      }
    }
  }
LAB_0010fd8c:
  operator_delete((void *)local_1b0._8_8_,local_198[0]._0_8_ + 1);
  return pVVar5;
}

Assistant:

ValueNode* Parser::gr_value()
{
	ValueNode* node = new ValueNode;

	if (lookahead(T_OpenParanthese)) {
		match(T_OpenParanthese);

		node->Type		 = VNT_Statement;
		node->_Statement = gr_statement();

		match(T_CloseParanthese);
	} else if (lookahead(T_OpenSquareBracket)) // Anonymous group
	{
		match(T_OpenSquareBracket);

		node->Type		 = VNT_Statement;
		node->_Statement = gr_array();

		match(T_CloseSquareBracket);
	} else if (lookahead(T_ExpressionParanthese)) {
		match(T_ExpressionParanthese);

		node->Type		  = VNT_Expression;
		node->_Expression = gr_expression();

		match(T_CloseParanthese);
	} else if (lookahead(T_Integer)) {
		Token str = match(T_Integer);

		node->Type = VNT_Integer;
		std::istringstream(str.Value) >> node->_Integer;
	} else if (lookahead(T_Float)) {
		Token str = match(T_Float);

		node->Type = VNT_Float;
		std::istringstream(str.Value) >> node->_Float;
	} else if (lookahead(T_String)) {
		Token str = match(T_String);

		node->Type	= VNT_String;
		node->_String = str.Value;
	} else if (lookahead(T_True)) {
		match(T_True);

		node->Type	 = VNT_Boolean;
		node->_Boolean = true;
	} else if (lookahead(T_False)) {
		match(T_False);

		node->Type	 = VNT_Boolean;
		node->_Boolean = false;
	} else {
		node->Type = VNT_Unknown;

		std::stringstream stream;
		stream << "INTERNAL: Unknown lookahead '" << tokenToString(mLexer.look().Type) << "' for values.";
		mLogger->log(mLexer.currentLine(), mLexer.currentColumn(), L_Fatal, stream.str());
	}

	return node;
}